

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestBase.cpp
# Opt level: O3

void Tests::AddExpressionEvaluionFail(char *reason)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  ulong uVar5;
  
  uVar1 = expressionEvaluionFails;
  uVar5 = (ulong)expressionEvaluionFails;
  if (uVar5 != 0) {
    lVar4 = 0;
    do {
      iVar2 = strcmp(*(char **)((long)&expressionEvaluionFailInfo + lVar4),reason);
      if (iVar2 == 0) {
        *(int *)((long)&DAT_003eceb8 + lVar4) = *(int *)((long)&DAT_003eceb8 + lVar4) + 1;
        return;
      }
      lVar4 = lVar4 + 0x10;
    } while (uVar5 << 4 != lVar4);
    if (0x7f < uVar1) {
      __assert_fail("expressionEvaluionFails < 128",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/tests/TestBase.cpp"
                    ,0xd5,"void Tests::AddExpressionEvaluionFail(const char *)");
    }
  }
  pcVar3 = strdup(reason);
  (&expressionEvaluionFailInfo)[uVar5 * 2] = pcVar3;
  (&DAT_003eceb8)[uVar5 * 4] = 1;
  expressionEvaluionFails = uVar1 + 1;
  return;
}

Assistant:

void AddExpressionEvaluionFail(const char *reason)
	{
		for(unsigned i = 0; i < expressionEvaluionFails; i++)
		{
			if(strcmp(expressionEvaluionFailInfo[i].reason, reason) == 0)
			{
				expressionEvaluionFailInfo[i].count++;
				return;
			}
		}
		assert(expressionEvaluionFails < 128);

		if(expressionEvaluionFails < 128)
		{
			expressionEvaluionFailInfo[expressionEvaluionFails].reason = strdup(reason);
			expressionEvaluionFailInfo[expressionEvaluionFails].count = 1;
			expressionEvaluionFails++;
		}
	}